

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::traverseField
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *field,QPDFObjectHandle *parent,
          int depth,set *visited)

{
  bool bVar1;
  element_type *peVar2;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *this_00;
  mapped_type *this_01;
  pointer ppVar3;
  mapped_type *this_02;
  mapped_type *pmVar4;
  bool local_409;
  QPDFObjectHandle *local_3d8;
  bool local_3aa;
  undefined1 local_320 [8];
  string old_name;
  _Self local_2f8;
  iterator old;
  string name;
  QPDFObjGen f_og;
  undefined1 local_2b8 [8];
  QPDFFormFieldObjectHelper foh;
  string local_278;
  QPDFObjectHandle local_258;
  QPDFFormFieldObjectHelper local_248;
  QPDFObjGen local_210;
  undefined1 local_208 [8];
  QPDFObjectHandle our_field;
  string local_1f0;
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  QPDFObjectHandle local_158;
  QPDFObjectHandle local_148;
  reference local_138;
  QPDFObjectHandle *item;
  iterator __end2;
  iterator __begin2;
  Array *__range2;
  string local_110 [32];
  QPDFObjectHandle local_f0;
  undefined1 local_e0 [8];
  Array a;
  undefined1 local_c0 [5];
  bool is_field;
  bool is_annotation;
  QPDFObjGen local_9c;
  QPDFObjGen local_94;
  QPDFObjGen og;
  allocator<char> local_51;
  string local_50;
  set *local_30;
  set *visited_local;
  QPDFObjectHandle *pQStack_20;
  int depth_local;
  QPDFObjectHandle *parent_local;
  QPDFObjectHandle *field_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  if (depth < 0x65) {
    local_30 = visited;
    visited_local._4_4_ = depth;
    pQStack_20 = parent;
    parent_local = field;
    field_local = (QPDFObjectHandle *)this;
    bVar1 = QPDFObjectHandle::isIndirect(field);
    if (bVar1) {
      bVar1 = QPDFObjectHandle::isDictionary(field);
      if (bVar1) {
        local_9c = QPDFObjectHandle::getObjGen(field);
        local_94 = local_9c;
        bVar1 = QPDFObjGen::set::add(local_30,local_9c);
        if (bVar1) {
          a.sp_elements._M_t.
          super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          .
          super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
          ._M_head_impl._6_1_ = 0;
          a.sp_elements._M_t.
          super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          .
          super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
          ._M_head_impl._5_1_ = visited_local._4_4_ == 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_110,"/Kids",(allocator<char> *)((long)&__range2 + 7));
          QPDFObjectHandle::getKey(&local_f0,(string *)field);
          QPDFObjectHandle::as_array((Array *)local_e0,&local_f0,strict);
          QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
          bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_e0);
          if (bVar1) {
            a.sp_elements._M_t.
            super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            .
            super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
            ._M_head_impl._5_1_ = 1;
            __end2 = ::qpdf::Array::begin((Array *)local_e0);
            item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)local_e0);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                               *)&item), bVar1) {
              local_138 = __gnu_cxx::
                          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                          ::operator*(&__end2);
              QPDFObjectHandle::QPDFObjectHandle(&local_148,local_138);
              QPDFObjectHandle::QPDFObjectHandle(&local_158,field);
              traverseField(this,&local_148,&local_158,visited_local._4_4_ + 1,local_30);
              QPDFObjectHandle::~QPDFObjectHandle(&local_158);
              QPDFObjectHandle::~QPDFObjectHandle(&local_148);
              __gnu_cxx::
              __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator++(&__end2);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,"/Parent",&local_179);
            bVar1 = QPDFObjectHandle::hasKey(field,&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator(&local_179);
            if (bVar1) {
              a.sp_elements._M_t.
              super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              .
              super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
              ._M_head_impl._5_1_ = 1;
            }
            std::allocator<char>::allocator();
            local_1ca = 0;
            local_1cb = 0;
            our_field.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
            our_field.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"/Subtype",&local_1a1);
            bVar1 = QPDFObjectHandle::hasKey(field,&local_1a0);
            local_3aa = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_1ca = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c8,"/Rect",&local_1c9);
              local_1cb = 1;
              bVar1 = QPDFObjectHandle::hasKey(field,&local_1c8);
              local_3aa = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                our_field.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
                     1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f0,"/AP",
                           (allocator<char> *)
                           ((long)&our_field.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 7));
                our_field.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
                     1;
                local_3aa = QPDFObjectHandle::hasKey(field,&local_1f0);
              }
            }
            if ((our_field.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
                & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1f0);
            }
            if ((our_field.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
                & 1) != 0) {
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&our_field.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
            }
            if ((local_1cb & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1c8);
            }
            if ((local_1ca & 1) != 0) {
              std::allocator<char>::~allocator(&local_1c9);
            }
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator(&local_1a1);
            if (local_3aa != false) {
              a.sp_elements._M_t.
              super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              .
              super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
              ._M_head_impl._6_1_ = 1;
            }
          }
          ::qpdf::Array::~Array((Array *)local_e0);
          QTC::TC("qpdf","QPDFAcroFormDocumentHelper field found",(uint)(visited_local._4_4_ != 0));
          QTC::TC("qpdf","QPDFAcroFormDocumentHelper annotation found",
                  (uint)((a.sp_elements._M_t.
                          super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                          .
                          super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                          ._M_head_impl._5_1_ & 1) == 0));
          if ((a.sp_elements._M_t.
               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               .
               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               ._M_head_impl._6_1_ & 1) != 0) {
            local_3d8 = parent;
            if ((a.sp_elements._M_t.
                 super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                 ._M_head_impl._5_1_ & 1) != 0) {
              local_3d8 = field;
            }
            QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_208,local_3d8);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            local_210 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_208);
            this_00 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>
                       *)std::
                         map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                         ::operator[](&peVar2->field_to_annotations,&local_210);
            std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
            emplace_back<QPDFObjectHandle&>(this_00,field);
            QPDFObjectHandle::QPDFObjectHandle(&local_258,(QPDFObjectHandle *)local_208);
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_248,&local_258);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            this_01 = std::
                      map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
                      ::operator[](&peVar2->annotation_to_field,&local_94);
            QPDFFormFieldObjectHelper::operator=(this_01,&local_248);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_248);
            QPDFObjectHandle::~QPDFObjectHandle(&local_258);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_208);
          }
          foh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_1_ = 0;
          foh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._5_1_ = 0;
          local_409 = false;
          if ((a.sp_elements._M_t.
               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               .
               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               ._M_head_impl._5_1_ & 1) != 0) {
            std::allocator<char>::allocator();
            foh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"/T",
                       (allocator<char> *)
                       ((long)&foh.m.
                               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            foh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._5_1_ = 1;
            local_409 = QPDFObjectHandle::hasKey(field,&local_278);
          }
          if ((foh.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_278);
          }
          if ((foh.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&foh.m.
                               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
          }
          if (local_409 != false) {
            QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&f_og,field);
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_2b8,(QPDFObjectHandle *)&f_og);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&f_og);
            name.field_2._8_8_ = QPDFObjectHandle::getObjGen(field);
            QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
                      ((string *)&old,(QPDFFormFieldObjectHelper *)local_2b8);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            local_2f8._M_node =
                 (_Base_ptr)
                 std::
                 map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&peVar2->field_to_name,(key_type *)((long)&name.field_2 + 8));
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            old_name.field_2._8_8_ =
                 std::
                 map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&peVar2->field_to_name);
            bVar1 = std::operator!=(&local_2f8,(_Self *)((long)&old_name.field_2 + 8));
            if (bVar1) {
              ppVar3 = std::
                       _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator->(&local_2f8);
              std::__cxx11::string::string((string *)local_320,(string *)&ppVar3->second);
              peVar2 = std::
                       __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->m);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::operator[](&peVar2->name_to_fields,(key_type *)local_320);
              std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::erase
                        (pmVar4,(key_type *)((long)&name.field_2 + 8));
              std::__cxx11::string::~string((string *)local_320);
            }
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            this_02 = std::
                      map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&peVar2->field_to_name,(key_type *)((long)&name.field_2 + 8));
            std::__cxx11::string::operator=((string *)this_02,(string *)&old);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[](&peVar2->name_to_fields,(key_type *)&old);
            std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                      (pmVar4,(value_type *)((long)&name.field_2 + 8));
            std::__cxx11::string::~string((string *)&old);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_2b8);
          }
        }
        else {
          QTC::TC("qpdf","QPDFAcroFormDocumentHelper loop",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c0,"loop detected while traversing /AcroForm",
                     (allocator<char> *)
                     ((long)&a.sp_elements._M_t.
                             super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                     + 7));
          QPDFObjectHandle::warnIfPossible(field,(string *)local_c0);
          std::__cxx11::string::~string((string *)local_c0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&a.sp_elements._M_t.
                             super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                     + 7));
        }
      }
      else {
        QTC::TC("qpdf","QPDFAcroFormDocumentHelper non-dictionary field",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&og.gen,
                   "encountered a non-dictionary as a field or annotation while traversing /AcroForm; ignoring field or annotation"
                   ,(allocator<char> *)((long)&og.obj + 3));
        QPDFObjectHandle::warnIfPossible(field,(string *)&og.gen);
        std::__cxx11::string::~string((string *)&og.gen);
        std::allocator<char>::~allocator((allocator<char> *)((long)&og.obj + 3));
      }
    }
    else {
      QTC::TC("qpdf","QPDFAcroFormDocumentHelper direct field",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "encountered a direct object as a field or annotation while traversing /AcroForm; ignoring field or annotation"
                 ,&local_51);
      QPDFObjectHandle::warnIfPossible(field,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::traverseField(
    QPDFObjectHandle field, QPDFObjectHandle parent, int depth, QPDFObjGen::set& visited)
{
    if (depth > 100) {
        // Arbitrarily cut off recursion at a fixed depth to avoid specially crafted files that
        // could cause stack overflow.
        return;
    }
    if (!field.isIndirect()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper direct field");
        field.warnIfPossible(
            "encountered a direct object as a field or annotation while "
            "traversing /AcroForm; ignoring field or annotation");
        return;
    }
    if (!field.isDictionary()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper non-dictionary field");
        field.warnIfPossible(
            "encountered a non-dictionary as a field or annotation while"
            " traversing /AcroForm; ignoring field or annotation");
        return;
    }
    QPDFObjGen og(field.getObjGen());
    if (!visited.add(og)) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper loop");
        field.warnIfPossible("loop detected while traversing /AcroForm");
        return;
    }

    // A dictionary encountered while traversing the /AcroForm field may be a form field, an
    // annotation, or the merger of the two. A field that has no fields below it is a terminal. If a
    // terminal field looks like an annotation, it is an annotation because annotation dictionary
    // fields can be merged with terminal field dictionaries. Otherwise, the annotation fields might
    // be there to be inherited by annotations below it.

    bool is_annotation = false;
    bool is_field = (0 == depth);
    if (auto a = field.getKey("/Kids").as_array(strict)) {
        is_field = true;
        for (auto const& item: a) {
            traverseField(item, field, 1 + depth, visited);
        }
    } else {
        if (field.hasKey("/Parent")) {
            is_field = true;
        }
        if (field.hasKey("/Subtype") || field.hasKey("/Rect") || field.hasKey("/AP")) {
            is_annotation = true;
        }
    }

    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper field found", (depth == 0) ? 0 : 1);
    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper annotation found", (is_field ? 0 : 1));

    if (is_annotation) {
        QPDFObjectHandle our_field = (is_field ? field : parent);
        m->field_to_annotations[our_field.getObjGen()].emplace_back(field);
        m->annotation_to_field[og] = QPDFFormFieldObjectHelper(our_field);
    }

    if (is_field && (field.hasKey("/T"))) {
        QPDFFormFieldObjectHelper foh(field);
        auto f_og = field.getObjGen();
        std::string name = foh.getFullyQualifiedName();
        auto old = m->field_to_name.find(f_og);
        if (old != m->field_to_name.end()) {
            // We might be updating after a name change, so remove any old information
            std::string old_name = old->second;
            m->name_to_fields[old_name].erase(f_og);
        }
        m->field_to_name[f_og] = name;
        m->name_to_fields[name].insert(f_og);
    }
}